

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_encoder.cc
# Opt level: O1

bool __thiscall
draco::PlyEncoder::EncodeToBuffer(PlyEncoder *this,Mesh *mesh,EncoderBuffer *out_buffer)

{
  bool bVar1;
  
  this->in_mesh_ = mesh;
  this->in_point_cloud_ = &mesh->super_PointCloud;
  this->out_buffer_ = out_buffer;
  bVar1 = EncodeInternal(this);
  this->out_buffer_ = (EncoderBuffer *)0x0;
  this->in_point_cloud_ = (PointCloud *)0x0;
  this->in_mesh_ = (Mesh *)0x0;
  return bVar1;
}

Assistant:

bool PlyEncoder::EncodeToBuffer(const Mesh &mesh, EncoderBuffer *out_buffer) {
  in_mesh_ = &mesh;
  return EncodeToBuffer(static_cast<const PointCloud &>(mesh), out_buffer);
}